

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_materialized_collector.cpp
# Opt level: O3

unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true> __thiscall
duckdb::PhysicalMaterializedCollector::GetLocalSinkState
          (PhysicalMaterializedCollector *this,ExecutionContext *context)

{
  Allocator *allocator_p;
  ColumnDataCollection *this_00;
  pointer pMVar1;
  pointer this_01;
  pointer *__ptr;
  __uniq_ptr_impl<duckdb::MaterializedCollectorLocalState,_std::default_delete<duckdb::MaterializedCollectorLocalState>_>
  local_48;
  ColumnDataCollection *local_40;
  vector<duckdb::LogicalType,_true> local_38;
  
  local_48._M_t.
  super__Tuple_impl<0UL,_duckdb::MaterializedCollectorLocalState_*,_std::default_delete<duckdb::MaterializedCollectorLocalState>_>
  .super__Head_base<0UL,_duckdb::MaterializedCollectorLocalState_*,_false>._M_head_impl =
       (tuple<duckdb::MaterializedCollectorLocalState_*,_std::default_delete<duckdb::MaterializedCollectorLocalState>_>
        )operator_new(0x90);
  *(_func_int **)
   ((long)local_48._M_t.
          super__Tuple_impl<0UL,_duckdb::MaterializedCollectorLocalState_*,_std::default_delete<duckdb::MaterializedCollectorLocalState>_>
          .super__Head_base<0UL,_duckdb::MaterializedCollectorLocalState_*,_false>._M_head_impl +
   0x50) = (_func_int *)0x0;
  *(_func_int **)
   ((long)local_48._M_t.
          super__Tuple_impl<0UL,_duckdb::MaterializedCollectorLocalState_*,_std::default_delete<duckdb::MaterializedCollectorLocalState>_>
          .super__Head_base<0UL,_duckdb::MaterializedCollectorLocalState_*,_false>._M_head_impl +
   0x58) = (_func_int *)0x0;
  *(_func_int **)
   ((long)local_48._M_t.
          super__Tuple_impl<0UL,_duckdb::MaterializedCollectorLocalState_*,_std::default_delete<duckdb::MaterializedCollectorLocalState>_>
          .super__Head_base<0UL,_duckdb::MaterializedCollectorLocalState_*,_false>._M_head_impl +
   0x70) = (_func_int *)0x0;
  *(_func_int **)
   ((long)local_48._M_t.
          super__Tuple_impl<0UL,_duckdb::MaterializedCollectorLocalState_*,_std::default_delete<duckdb::MaterializedCollectorLocalState>_>
          .super__Head_base<0UL,_duckdb::MaterializedCollectorLocalState_*,_false>._M_head_impl +
   0x78) = (_func_int *)0x0;
  *(undefined4 *)
   ((long)local_48._M_t.
          super__Tuple_impl<0UL,_duckdb::MaterializedCollectorLocalState_*,_std::default_delete<duckdb::MaterializedCollectorLocalState>_>
          .super__Head_base<0UL,_duckdb::MaterializedCollectorLocalState_*,_false>._M_head_impl + 8)
       = 0xffffffff;
  *(undefined4 *)
   ((long)local_48._M_t.
          super__Tuple_impl<0UL,_duckdb::MaterializedCollectorLocalState_*,_std::default_delete<duckdb::MaterializedCollectorLocalState>_>
          .super__Head_base<0UL,_duckdb::MaterializedCollectorLocalState_*,_false>._M_head_impl +
   0xc) = 0xffffffff;
  *(undefined4 *)
   ((long)local_48._M_t.
          super__Tuple_impl<0UL,_duckdb::MaterializedCollectorLocalState_*,_std::default_delete<duckdb::MaterializedCollectorLocalState>_>
          .super__Head_base<0UL,_duckdb::MaterializedCollectorLocalState_*,_false>._M_head_impl +
   0x10) = 0xffffffff;
  *(undefined4 *)
   ((long)local_48._M_t.
          super__Tuple_impl<0UL,_duckdb::MaterializedCollectorLocalState_*,_std::default_delete<duckdb::MaterializedCollectorLocalState>_>
          .super__Head_base<0UL,_duckdb::MaterializedCollectorLocalState_*,_false>._M_head_impl +
   0x14) = 0xffffffff;
  *(_func_int **)
   ((long)local_48._M_t.
          super__Tuple_impl<0UL,_duckdb::MaterializedCollectorLocalState_*,_std::default_delete<duckdb::MaterializedCollectorLocalState>_>
          .super__Head_base<0UL,_duckdb::MaterializedCollectorLocalState_*,_false>._M_head_impl +
   0x18) = (_func_int *)0x0;
  *(_func_int **)
   ((long)local_48._M_t.
          super__Tuple_impl<0UL,_duckdb::MaterializedCollectorLocalState_*,_std::default_delete<duckdb::MaterializedCollectorLocalState>_>
          .super__Head_base<0UL,_duckdb::MaterializedCollectorLocalState_*,_false>._M_head_impl +
   0x20) = (_func_int *)0x0;
  *(_func_int **)
   ((long)local_48._M_t.
          super__Tuple_impl<0UL,_duckdb::MaterializedCollectorLocalState_*,_std::default_delete<duckdb::MaterializedCollectorLocalState>_>
          .super__Head_base<0UL,_duckdb::MaterializedCollectorLocalState_*,_false>._M_head_impl +
   0x28) = (_func_int *)0x0;
  *(_func_int **)
   ((long)local_48._M_t.
          super__Tuple_impl<0UL,_duckdb::MaterializedCollectorLocalState_*,_std::default_delete<duckdb::MaterializedCollectorLocalState>_>
          .super__Head_base<0UL,_duckdb::MaterializedCollectorLocalState_*,_false>._M_head_impl +
   0x30) = (_func_int *)0x0;
  *(undefined ***)
   local_48._M_t.
   super__Tuple_impl<0UL,_duckdb::MaterializedCollectorLocalState_*,_std::default_delete<duckdb::MaterializedCollectorLocalState>_>
   .super__Head_base<0UL,_duckdb::MaterializedCollectorLocalState_*,_false>._M_head_impl =
       &PTR__MaterializedCollectorLocalState_024692b0;
  *(_func_int ***)
   ((long)local_48._M_t.
          super__Tuple_impl<0UL,_duckdb::MaterializedCollectorLocalState_*,_std::default_delete<duckdb::MaterializedCollectorLocalState>_>
          .super__Head_base<0UL,_duckdb::MaterializedCollectorLocalState_*,_false>._M_head_impl +
   0x38) = (_func_int **)
           ((long)local_48._M_t.
                  super__Tuple_impl<0UL,_duckdb::MaterializedCollectorLocalState_*,_std::default_delete<duckdb::MaterializedCollectorLocalState>_>
                  .super__Head_base<0UL,_duckdb::MaterializedCollectorLocalState_*,_false>.
                  _M_head_impl + 0x68);
  *(_func_int **)
   ((long)local_48._M_t.
          super__Tuple_impl<0UL,_duckdb::MaterializedCollectorLocalState_*,_std::default_delete<duckdb::MaterializedCollectorLocalState>_>
          .super__Head_base<0UL,_duckdb::MaterializedCollectorLocalState_*,_false>._M_head_impl +
   0x40) = (_func_int *)0x1;
  *(_func_int **)
   ((long)local_48._M_t.
          super__Tuple_impl<0UL,_duckdb::MaterializedCollectorLocalState_*,_std::default_delete<duckdb::MaterializedCollectorLocalState>_>
          .super__Head_base<0UL,_duckdb::MaterializedCollectorLocalState_*,_false>._M_head_impl +
   0x48) = (_func_int *)0x0;
  *(_func_int **)
   ((long)local_48._M_t.
          super__Tuple_impl<0UL,_duckdb::MaterializedCollectorLocalState_*,_std::default_delete<duckdb::MaterializedCollectorLocalState>_>
          .super__Head_base<0UL,_duckdb::MaterializedCollectorLocalState_*,_false>._M_head_impl +
   0x50) = (_func_int *)0x0;
  *(undefined4 *)
   ((long)local_48._M_t.
          super__Tuple_impl<0UL,_duckdb::MaterializedCollectorLocalState_*,_std::default_delete<duckdb::MaterializedCollectorLocalState>_>
          .super__Head_base<0UL,_duckdb::MaterializedCollectorLocalState_*,_false>._M_head_impl +
   0x58) = 0x3f800000;
  *(_func_int **)
   ((long)local_48._M_t.
          super__Tuple_impl<0UL,_duckdb::MaterializedCollectorLocalState_*,_std::default_delete<duckdb::MaterializedCollectorLocalState>_>
          .super__Head_base<0UL,_duckdb::MaterializedCollectorLocalState_*,_false>._M_head_impl +
   0x60) = (_func_int *)0x0;
  *(_func_int **)
   ((long)local_48._M_t.
          super__Tuple_impl<0UL,_duckdb::MaterializedCollectorLocalState_*,_std::default_delete<duckdb::MaterializedCollectorLocalState>_>
          .super__Head_base<0UL,_duckdb::MaterializedCollectorLocalState_*,_false>._M_head_impl +
   0x68) = (_func_int *)0x0;
  *(undefined1 *)
   ((long)local_48._M_t.
          super__Tuple_impl<0UL,_duckdb::MaterializedCollectorLocalState_*,_std::default_delete<duckdb::MaterializedCollectorLocalState>_>
          .super__Head_base<0UL,_duckdb::MaterializedCollectorLocalState_*,_false>._M_head_impl +
   0x70) = 0;
  *(_func_int **)
   ((long)local_48._M_t.
          super__Tuple_impl<0UL,_duckdb::MaterializedCollectorLocalState_*,_std::default_delete<duckdb::MaterializedCollectorLocalState>_>
          .super__Head_base<0UL,_duckdb::MaterializedCollectorLocalState_*,_false>._M_head_impl +
   0x78) = (_func_int *)0x0;
  *(_func_int **)
   ((long)local_48._M_t.
          super__Tuple_impl<0UL,_duckdb::MaterializedCollectorLocalState_*,_std::default_delete<duckdb::MaterializedCollectorLocalState>_>
          .super__Head_base<0UL,_duckdb::MaterializedCollectorLocalState_*,_false>._M_head_impl +
   0x80) = (_func_int *)0x0;
  *(_func_int **)
   ((long)local_48._M_t.
          super__Tuple_impl<0UL,_duckdb::MaterializedCollectorLocalState_*,_std::default_delete<duckdb::MaterializedCollectorLocalState>_>
          .super__Head_base<0UL,_duckdb::MaterializedCollectorLocalState_*,_false>._M_head_impl +
   0x88) = (_func_int *)0x0;
  allocator_p = Allocator::DefaultAllocator();
  this_00 = (ColumnDataCollection *)operator_new(0x70);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_38,
             (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
             &context[1].pipeline);
  ColumnDataCollection::ColumnDataCollection(this_00,allocator_p,&local_38);
  local_40 = this_00;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_38);
  pMVar1 = unique_ptr<duckdb::MaterializedCollectorLocalState,_std::default_delete<duckdb::MaterializedCollectorLocalState>,_true>
           ::operator->((unique_ptr<duckdb::MaterializedCollectorLocalState,_std::default_delete<duckdb::MaterializedCollectorLocalState>,_true>
                         *)&local_48);
  ::std::
  __uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
  ::reset((__uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
           *)&pMVar1->collection,this_00);
  pMVar1 = unique_ptr<duckdb::MaterializedCollectorLocalState,_std::default_delete<duckdb::MaterializedCollectorLocalState>,_true>
           ::operator->((unique_ptr<duckdb::MaterializedCollectorLocalState,_std::default_delete<duckdb::MaterializedCollectorLocalState>,_true>
                         *)&local_48);
  this_01 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
            ::operator->(&pMVar1->collection);
  pMVar1 = unique_ptr<duckdb::MaterializedCollectorLocalState,_std::default_delete<duckdb::MaterializedCollectorLocalState>,_true>
           ::operator->((unique_ptr<duckdb::MaterializedCollectorLocalState,_std::default_delete<duckdb::MaterializedCollectorLocalState>,_true>
                         *)&local_48);
  ColumnDataCollection::InitializeAppend(this_01,&pMVar1->append_state);
  (this->super_PhysicalResultCollector).super_PhysicalOperator._vptr_PhysicalOperator =
       (_func_int **)
       local_48._M_t.
       super__Tuple_impl<0UL,_duckdb::MaterializedCollectorLocalState_*,_std::default_delete<duckdb::MaterializedCollectorLocalState>_>
       .super__Head_base<0UL,_duckdb::MaterializedCollectorLocalState_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>)
         (unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>)this;
}

Assistant:

unique_ptr<LocalSinkState> PhysicalMaterializedCollector::GetLocalSinkState(ExecutionContext &context) const {
	auto state = make_uniq<MaterializedCollectorLocalState>();
	state->collection = make_uniq<ColumnDataCollection>(Allocator::DefaultAllocator(), types);
	state->collection->InitializeAppend(state->append_state);
	return std::move(state);
}